

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFContext::getLineTableForUnit
          (DWARFContext *this,DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  unsigned_long uVar1;
  DWARFLineTable *pDVar2;
  bool bVar3;
  uint8_t AddressSize;
  uint32_t uVar4;
  DWARFDebugLine *this_00;
  unsigned_long *puVar5;
  pointer this_01;
  StringRef *this_02;
  DWARFLineTable *pDVar6;
  type Obj;
  DWARFSection *Section;
  DWARFDataExtractor *DebugLineData;
  function<void_(llvm::Error)> *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  Optional<unsigned_long> OVar8;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar9;
  function<void_(llvm::Error)> local_f0;
  undefined1 local_d0 [8];
  DWARFDataExtractor lineData;
  LineTable *local_a0;
  DWARFLineTable *lt;
  uint64_t stmtOffset;
  Optional<llvm::DWARFFormValue> local_88;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_50;
  Optional<unsigned_long> Offset;
  undefined1 local_38 [8];
  DWARFDie UnitDIE;
  function<void_(llvm::Error)> *RecoverableErrorCallback_local;
  DWARFUnit *U_local;
  DWARFContext *this_local;
  
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&(U->field_7).LocSectionData);
  if (!bVar3) {
    this_00 = (DWARFDebugLine *)operator_new(0x30);
    DWARFDebugLine::DWARFDebugLine(this_00);
    std::unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::reset
              ((unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_> *)
               &(U->field_7).LocSectionData,this_00);
  }
  _local_38 = DWARFUnit::getUnitDIE((DWARFUnit *)RecoverableErrorCallback,true);
  bVar3 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_38);
  if (bVar3) {
    DWARFDie::find(&local_88,(DWARFDie *)local_38,DW_AT_stmt_list);
    OVar8 = dwarf::toSectionOffset(&local_88);
    local_50 = OVar8.Storage.field_0;
    Offset.Storage.field_0.empty = OVar8.Storage.hasVal;
    bVar3 = llvm::Optional::operator_cast_to_bool((Optional *)&local_50.empty);
    if (bVar3) {
      puVar5 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_50);
      uVar1 = *puVar5;
      uVar4 = DWARFUnit::getLineTableOffset((DWARFUnit *)RecoverableErrorCallback);
      lt = (DWARFLineTable *)(uVar1 + uVar4);
      this_01 = std::unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::
                operator->((unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>
                            *)&(U->field_7).LocSectionData);
      local_a0 = DWARFDebugLine::getLineTable(this_01,(uint64_t)lt);
      pDVar2 = lt;
      if (local_a0 == (LineTable *)0x0) {
        this_02 = &DWARFUnit::getLineSection((DWARFUnit *)RecoverableErrorCallback)->Data;
        pDVar6 = (DWARFLineTable *)StringRef::size(this_02);
        if (pDVar2 < pDVar6) {
          Obj = std::
                unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
                operator*((unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                           *)&(U->RngListTable).Storage.field_0.value.
                              super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length)
          ;
          Section = DWARFUnit::getLineSection((DWARFUnit *)RecoverableErrorCallback);
          bVar3 = isLittleEndian((DWARFContext *)U);
          AddressSize = DWARFUnit::getAddressByteSize((DWARFUnit *)RecoverableErrorCallback);
          DWARFDataExtractor::DWARFDataExtractor
                    ((DWARFDataExtractor *)local_d0,Obj,Section,bVar3,AddressSize);
          DebugLineData =
               (DWARFDataExtractor *)
               std::unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::
               operator->((unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>
                           *)&(U->field_7).LocSectionData);
          pDVar2 = lt;
          std::function<void_(llvm::Error)>::function(&local_f0,in_RCX);
          DWARFDebugLine::getOrParseLineTable
                    ((DWARFDebugLine *)this,DebugLineData,(uint64_t)local_d0,(DWARFContext *)pDVar2,
                     U,RecoverableErrorCallback);
          std::function<void_(llvm::Error)>::~function(&local_f0);
          uVar7 = extraout_RDX_03;
        }
        else {
          lineData.Section = (DWARFSection *)0x0;
          Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<decltype(nullptr)>
                    ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,&lineData.Section,
                     (type *)0x0);
          uVar7 = extraout_RDX_02;
        }
      }
      else {
        Expected<llvm::DWARFDebugLine::LineTable_const*>::
        Expected<llvm::DWARFDebugLine::LineTable_const*>
                  ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,&local_a0,(type *)0x0);
        uVar7 = extraout_RDX_01;
      }
    }
    else {
      stmtOffset = 0;
      Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<decltype(nullptr)>
                ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,(void **)&stmtOffset,
                 (type *)0x0);
      uVar7 = extraout_RDX_00;
    }
  }
  else {
    Offset.Storage.hasVal = false;
    Offset.Storage._9_7_ = 0;
    Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<decltype(nullptr)>
              ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,
               (void **)&Offset.Storage.hasVal,(type *)0x0);
    uVar7 = extraout_RDX;
  }
  EVar9._8_8_ = uVar7;
  EVar9.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar9;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFContext::getLineTableForUnit(
    DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!Line)
    Line.reset(new DWARFDebugLine);

  auto UnitDIE = U->getUnitDIE();
  if (!UnitDIE)
    return nullptr;

  auto Offset = toSectionOffset(UnitDIE.find(DW_AT_stmt_list));
  if (!Offset)
    return nullptr; // No line table for this compile unit.

  uint64_t stmtOffset = *Offset + U->getLineTableOffset();
  // See if the line table is cached.
  if (const DWARFLineTable *lt = Line->getLineTable(stmtOffset))
    return lt;

  // Make sure the offset is good before we try to parse.
  if (stmtOffset >= U->getLineSection().Data.size())
    return nullptr;

  // We have to parse it first.
  DWARFDataExtractor lineData(*DObj, U->getLineSection(), isLittleEndian(),
                              U->getAddressByteSize());
  return Line->getOrParseLineTable(lineData, stmtOffset, *this, U,
                                   RecoverableErrorCallback);
}